

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_cyberdemon.cpp
# Opt level: O0

int AF_A_CyberAttack(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  AActor *self_00;
  DObject *this;
  AActor *pAVar1;
  PClassActor *type;
  bool bVar2;
  bool local_56;
  bool local_53;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  VMValue *param_local;
  VMFrameStack *stack_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                  ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar2) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_53 = true;
    if (self_00 != (AActor *)0x0) {
      local_53 = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_53 != false) {
      if ((1 < numparam) && (param[1].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[1].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
          bVar2 = param[1].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                        ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
        this = (DObject *)param[1].field_0.field_1.a;
        local_56 = true;
        if (this != (DObject *)0x0) {
          local_56 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
        }
        if (local_56 == false) {
          __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                        ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      if ((2 < numparam) && (param[2].field_0.field_3.Type != 0xff)) {
        bVar2 = false;
        if ((param[2].field_0.field_3.Type == '\x03') &&
           (bVar2 = true, param[2].field_0.field_1.atag != 8)) {
          bVar2 = param[2].field_0.field_1.a == (void *)0x0;
        }
        if (!bVar2) {
          __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                        ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)"
                       );
        }
      }
      pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
      if (pAVar1 != (AActor *)0x0) {
        A_FaceTarget(self_00);
        pAVar1 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&self_00->target);
        type = PClass::FindActor("Rocket");
        P_SpawnMissile(self_00,pAVar1,type,(AActor *)0x0);
      }
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                  ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_cyberdemon.cpp"
                ,0xc,"int AF_A_CyberAttack(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_CyberAttack)
{
	PARAM_ACTION_PROLOGUE;

	if (!self->target)
		return 0;
				
	A_FaceTarget (self);
	P_SpawnMissile (self, self->target, PClass::FindActor("Rocket"));
	return 0;
}